

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmimetype.cpp
# Opt level: O0

void QMimeType::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  QList<QString> *other;
  QMimeType *in_RCX;
  uint in_EDX;
  int in_ESI;
  QMimeType *in_RDI;
  long in_FS_OFFSET;
  void *_v;
  bool _r;
  QMimeType *_t;
  QString *in_stack_fffffffffffffec0;
  QMimeTypePrivate *this;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  QMimeType *in_stack_fffffffffffffef0;
  QMimeType *in_stack_ffffffffffffff28;
  QMimeType *in_stack_ffffffffffffff50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_ESI == 0) && (in_EDX == 0)) &&
     (in_stack_fffffffffffffecf =
           inherits((QMimeType *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                    in_stack_fffffffffffffec0), (in_RCX->d).d.ptr != (QMimeTypePrivate *)0x0)) {
    *(undefined1 *)
     &(((in_RCX->d).d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value = in_stack_fffffffffffffecf;
  }
  if (in_ESI == 1) {
    this = (in_RCX->d).d.ptr;
    other = (QList<QString> *)(ulong)in_EDX;
    switch(other) {
    case (QList<QString> *)0x0:
      bVar2 = isValid((QMimeType *)0x90e22d);
      *(bool *)&((totally_ordered_wrapper<QMimeTypePrivate_*> *)
                &((DataPointer *)&this->super_QSharedData)->d)->ptr = bVar2;
      break;
    case (QList<QString> *)0x1:
      bVar2 = isDefault((QMimeType *)this);
      *(bool *)&((totally_ordered_wrapper<QMimeTypePrivate_*> *)
                &((DataPointer *)&this->super_QSharedData)->d)->ptr = bVar2;
      break;
    case (QList<QString> *)0x2:
      name((QMimeType *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      QString::operator=((QString *)this,(QString *)other);
      QString::~QString((QString *)0x90e28a);
      break;
    case (QList<QString> *)0x3:
      comment(in_stack_ffffffffffffff28);
      QString::operator=((QString *)this,(QString *)other);
      QString::~QString((QString *)0x90e2c0);
      break;
    case (QList<QString> *)0x4:
      genericIconName(in_stack_fffffffffffffef0);
      QString::operator=((QString *)this,(QString *)other);
      QString::~QString((QString *)0x90e2f6);
      break;
    case (QList<QString> *)0x5:
      iconName(in_stack_fffffffffffffef0);
      QString::operator=((QString *)this,(QString *)other);
      QString::~QString((QString *)0x90e32c);
      break;
    case (QList<QString> *)0x6:
      globPatterns(in_RCX);
      QList<QString>::operator=((QList<QString> *)this,other);
      QList<QString>::~QList((QList<QString> *)0x90e362);
      break;
    case (QList<QString> *)0x7:
      parentMimeTypes(in_RCX);
      QList<QString>::operator=((QList<QString> *)this,other);
      QList<QString>::~QList((QList<QString> *)0x90e398);
      break;
    case (QList<QString> *)0x8:
      allAncestors(in_RDI);
      QList<QString>::operator=((QList<QString> *)this,other);
      QList<QString>::~QList((QList<QString> *)0x90e3ce);
      break;
    case (QList<QString> *)0x9:
      aliases(in_RCX);
      QList<QString>::operator=((QList<QString> *)this,other);
      QList<QString>::~QList((QList<QString> *)0x90e404);
      break;
    case (QList<QString> *)0xa:
      suffixes(in_stack_ffffffffffffff50);
      QList<QString>::operator=((QList<QString> *)this,other);
      QList<QString>::~QList((QList<QString> *)0x90e431);
      break;
    case (QList<QString> *)0xb:
      preferredSuffix((QMimeType *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      QString::operator=((QString *)this,(QString *)other);
      QString::~QString((QString *)0x90e45b);
      break;
    case (QList<QString> *)0xc:
      filterString(in_RDI);
      QString::operator=((QString *)this,(QString *)other);
      QString::~QString((QString *)0x90e485);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeType::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = reinterpret_cast<QMimeType *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: { bool _r = _t->inherits((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isValid(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isDefault(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->name(); break;
        case 3: *reinterpret_cast<QString*>(_v) = _t->comment(); break;
        case 4: *reinterpret_cast<QString*>(_v) = _t->genericIconName(); break;
        case 5: *reinterpret_cast<QString*>(_v) = _t->iconName(); break;
        case 6: *reinterpret_cast<QStringList*>(_v) = _t->globPatterns(); break;
        case 7: *reinterpret_cast<QStringList*>(_v) = _t->parentMimeTypes(); break;
        case 8: *reinterpret_cast<QStringList*>(_v) = _t->allAncestors(); break;
        case 9: *reinterpret_cast<QStringList*>(_v) = _t->aliases(); break;
        case 10: *reinterpret_cast<QStringList*>(_v) = _t->suffixes(); break;
        case 11: *reinterpret_cast<QString*>(_v) = _t->preferredSuffix(); break;
        case 12: *reinterpret_cast<QString*>(_v) = _t->filterString(); break;
        default: break;
        }
    }
}